

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProblemDecTiger.cpp
# Opt level: O2

void __thiscall ProblemDecTiger::ProblemDecTiger(ProblemDecTiger *this)

{
  MADPComponentDiscreteStates *this_00;
  MADPComponentDiscreteActions *this_01;
  MADPComponentDiscreteObservations *this_02;
  allocator<char> local_7b;
  allocator<char> local_7a;
  allocator<char> local_79;
  string local_78;
  string local_58;
  string local_38;
  
  *(undefined ***)&this->field_0x240 = &PTR__POSGInterface_005e8020;
  DecPOMDPInterface::DecPOMDPInterface((DecPOMDPInterface *)&this->field_0x240,&PTR_PTR_005e67f8);
  *(undefined8 *)&this->field_0x248 = 0x5e8208;
  *(undefined8 *)&this->field_0x240 = 0x5e83b8;
  DecPOMDPDiscreteInterface::DecPOMDPDiscreteInterface
            ((DecPOMDPDiscreteInterface *)&this->field_0x240,&PTR_construction_vtable_232__005e67d0)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"The Dec-Tiger Problem",&local_79);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,
             "A toy problem, 2-agent Dec-POMDP. 2 agents have to select 1 out of 2 doors, behind one is a tiger, behind the other treasure."
             ,&local_7a);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"DecTiger",&local_7b);
  DecPOMDPDiscrete::DecPOMDPDiscrete
            (&this->super_DecPOMDPDiscrete,&PTR_construction_vtable_96__005e6720,&local_38,&local_58
             ,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  *(undefined8 *)
   &(this->super_DecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscrete.
    super_MultiAgentDecisionProcess = 0x5e5f48;
  *(undefined8 *)&this->field_0x240 = 0x5e6348;
  *(undefined8 *)&this->field_0x248 = 0x5e65a0;
  *(undefined8 *)&(this->super_DecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscrete.field_0x200
       = 0x5e61c0;
  *(undefined8 *)&(this->super_DecPOMDPDiscrete).field_0x220 = 2;
  *(undefined8 *)&(this->super_DecPOMDPDiscrete).field_0x228 = 2;
  this->NUMBER_OF_OBSERVATIONS = 2;
  this->NUMBER_OF_ACTIONS = 3;
  MultiAgentDecisionProcess::SetNrAgents((MultiAgentDecisionProcess *)this,2);
  this_00 = &(this->super_DecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscrete._m_S;
  MADPComponentDiscreteStates::SetNrStates
            (this_00,*(size_t *)&(this->super_DecPOMDPDiscrete).field_0x220);
  MADPComponentDiscreteStates::SetUniformISD(this_00);
  (**(code **)(*(long *)&(this->super_DecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscrete.
                         field_0x200 + 0x68))(0x3ff0000000000000);
  ConstructActions(this);
  this_01 = &(this->super_DecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscrete._m_A;
  MADPComponentDiscreteActions::ConstructJointActions(this_01);
  MADPComponentDiscreteActions::SetInitialized(this_01,true);
  ConstructObservations(this);
  this_02 = &(this->super_DecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscrete._m_O;
  MADPComponentDiscreteObservations::ConstructJointObservations(this_02);
  MADPComponentDiscreteObservations::SetInitialized(this_02,true);
  MultiAgentDecisionProcessDiscrete::CreateNewTransitionModel
            ((MultiAgentDecisionProcessDiscrete *)this);
  FillTransitionModel(this);
  MultiAgentDecisionProcessDiscrete::CreateNewObservationModel
            ((MultiAgentDecisionProcessDiscrete *)this);
  FillObservationModel(this);
  MultiAgentDecisionProcessDiscrete::SetInitialized((MultiAgentDecisionProcessDiscrete *)this,true);
  (**(code **)(*(long *)&(this->super_DecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscrete.
                         super_MultiAgentDecisionProcess + 0x178))(this);
  FillRewardModel(this);
  DecPOMDPDiscrete::SetInitialized(&this->super_DecPOMDPDiscrete,true);
  return;
}

Assistant:

ProblemDecTiger::ProblemDecTiger() :
    DecPOMDPDiscrete(
        "The Dec-Tiger Problem",
        "A toy problem, 2-agent Dec-POMDP. 2 agents have to select 1 out of 2 doors, behind one is a tiger, behind the other treasure.",
        "DecTiger"),
    NUMBER_OF_STATES(2),
    NUMBER_OF_AGENTS(2),
    NUMBER_OF_OBSERVATIONS(2),
    NUMBER_OF_ACTIONS(3)
{
    SetNrAgents(NUMBER_OF_AGENTS);
    SetNrStates(NUMBER_OF_STATES);

    SetUniformISD();
    SetDiscount(1);
    
    // add actions:
    ConstructActions();
    if(DEBUG_CJA) cout << "\n>>>Creating joint actions and set...\n"<<endl;
    // add joint actions
    size_t testNRJA = ConstructJointActions();
    if(DEBUG_CA) cout << "testNRJA="<<testNRJA<<endl;    

    SetActionsInitialized(true);

    // add observations:
    ConstructObservations();
    size_t testNRJO = ConstructJointObservations();
    if(DEBUG_CO) cout << "testNRJO="<<testNRJO<<endl;

    SetObservationsInitialized(true);

    // add the transition model
    if(DEBUG_PDT) cout << "\n>>>Adding Transition model...\n"<<endl;
    CreateNewTransitionModel();
    FillTransitionModel();    

    // add observation model
    if(DEBUG_PDT) cout << "\n>>>Adding Observation model...\n"<<endl;
    CreateNewObservationModel();
    FillObservationModel();
    MultiAgentDecisionProcessDiscrete::SetInitialized(true);

    // add rewards
    CreateNewRewardModel();
    FillRewardModel();
    if(DEBUG_PDT)     cout << "Model created..."<<endl; 
    DecPOMDPDiscrete::SetInitialized(true);
}